

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-rasterize.c
# Opt level: O2

PVG_FT_Outline *
ft_outline_convert(plutovg_path_t *path,plutovg_matrix_t *matrix,plutovg_stroke_data_t *stroke_data)

{
  PVG_FT_Vector *pPVar1;
  float fVar2;
  float fVar3;
  plutovg_line_cap_t pVar4;
  plutovg_line_join_t pVar5;
  double dVar6;
  PVG_FT_Pos PVar7;
  _Bool _Var8;
  plutovg_path_command_t pVar9;
  plutovg_path_t *path_00;
  PVG_FT_Outline *pPVar10;
  char *pcVar11;
  long lVar12;
  PVG_FT_Outline *outline;
  int iVar13;
  PVG_FT_Vector *pPVar14;
  PVG_FT_Stroker_LineCap line_cap;
  PVG_FT_Stroker_LineJoin line_join;
  plutovg_point_t points [3];
  PVG_FT_UInt local_44;
  plutovg_path_iterator_t it;
  
  if (stroke_data != (plutovg_stroke_data_t *)0x0) {
    dVar6 = hypot(SQRT((double)(matrix->a * matrix->a + matrix->b * matrix->b)),
                  SQRT((double)(matrix->c * matrix->c + matrix->d * matrix->d)));
    fVar2 = (stroke_data->style).miter_limit;
    pVar4 = (stroke_data->style).cap;
    pVar5 = (stroke_data->style).join;
    line_cap = (PVG_FT_Stroker_LineCap)(pVar4 == PLUTOVG_LINE_CAP_ROUND);
    if (pVar4 == PLUTOVG_LINE_CAP_SQUARE) {
      line_cap = PVG_FT_STROKER_LINECAP_SQUARE;
    }
    line_join = PVG_FT_STROKER_LINEJOIN_BEVEL;
    if (pVar5 != PLUTOVG_LINE_JOIN_BEVEL) {
      line_join = (uint)(pVar5 != PLUTOVG_LINE_JOIN_ROUND) * 3;
    }
    fVar3 = (stroke_data->style).width;
    PVG_FT_Stroker_New((PVG_FT_Stroker *)points);
    PVG_FT_Stroker_Set((PVG_FT_Stroker)CONCAT44(points[0].y,points[0].x),
                       (long)((double)fVar3 * (dVar6 / 1.4142135381698608) * 0.5 * 64.0),line_cap,
                       line_join,(long)(fVar2 * 65536.0));
    iVar13 = (stroke_data->dash).array.size;
    if (iVar13 == 0) {
      pPVar10 = ft_outline_convert(path,matrix,(plutovg_stroke_data_t *)0x0);
    }
    else {
      path_00 = plutovg_path_clone_dashed
                          (path,(stroke_data->dash).offset,(stroke_data->dash).array.data,iVar13);
      pPVar10 = ft_outline_convert(path_00,matrix,(plutovg_stroke_data_t *)0x0);
      plutovg_path_destroy(path_00);
    }
    PVG_FT_Stroker_ParseOutline((PVG_FT_Stroker)CONCAT44(points[0].y,points[0].x),pPVar10);
    PVG_FT_Stroker_GetCounts
              ((PVG_FT_Stroker)CONCAT44(points[0].y,points[0].x),(PVG_FT_UInt *)&it,&local_44);
    outline = ft_outline_create((int)it.elements,local_44);
    PVG_FT_Stroker_Export((PVG_FT_Stroker)CONCAT44(points[0].y,points[0].x),outline);
    PVG_FT_Stroker_Done((PVG_FT_Stroker)CONCAT44(points[0].y,points[0].x));
    free(pPVar10);
    return outline;
  }
  plutovg_path_iterator_init(&it,path);
  pPVar10 = ft_outline_create(path->num_points,path->num_contours);
switchD_0010ff5f_default:
  _Var8 = plutovg_path_iterator_has_next(&it);
  if (!_Var8) {
    if (pPVar10->n_points == 0) {
      return pPVar10;
    }
    pPVar10->contours[pPVar10->n_contours] = pPVar10->n_points + -1;
    pPVar10->n_contours = pPVar10->n_contours + 1;
    return pPVar10;
  }
  pVar9 = plutovg_path_iterator_next(&it,points);
  switch(pVar9) {
  case PLUTOVG_PATH_COMMAND_MOVE_TO:
    plutovg_matrix_map_points(matrix,points,points,1);
    pPVar14 = pPVar10->points;
    iVar13 = pPVar10->n_points;
    pPVar14[iVar13].x = (long)(points[0].x * 64.0);
    pPVar14[iVar13].y = (long)(points[0].y * 64.0);
    pPVar10->tags[iVar13] = '\x01';
    iVar13 = pPVar10->n_contours;
    if (pPVar10->n_points != 0) {
      pPVar10->contours[iVar13] = pPVar10->n_points + -1;
      iVar13 = pPVar10->n_contours + 1;
      pPVar10->n_contours = iVar13;
    }
    pcVar11 = pPVar10->contours_flag + iVar13;
    goto LAB_00110121;
  case PLUTOVG_PATH_COMMAND_LINE_TO:
    plutovg_matrix_map_points(matrix,points,points,1);
    pPVar14 = pPVar10->points;
    lVar12 = (long)pPVar10->n_points;
    fVar2 = points[0].x;
    fVar3 = points[0].y;
    break;
  case PLUTOVG_PATH_COMMAND_CUBIC_TO:
    plutovg_matrix_map_points(matrix,points,points,3);
    pPVar14 = pPVar10->points;
    iVar13 = pPVar10->n_points;
    pPVar14[iVar13].x = (long)(points[0].x * 64.0);
    pPVar14[iVar13].y = (long)(points[0].y * 64.0);
    pPVar10->tags[iVar13] = '\x02';
    iVar13 = pPVar10->n_points;
    lVar12 = (long)iVar13 + 1;
    pPVar10->n_points = (int)lVar12;
    pPVar14 = pPVar10->points;
    pPVar14[lVar12].x = (long)(points[1].x * 64.0);
    pPVar14[lVar12].y = (long)(points[1].y * 64.0);
    pPVar10->tags[(long)iVar13 + 1] = '\x02';
    lVar12 = (long)pPVar10->n_points + 1;
    pPVar10->n_points = (int)lVar12;
    pPVar14 = pPVar10->points;
    fVar2 = points[2].x;
    fVar3 = points[2].y;
    break;
  case PLUTOVG_PATH_COMMAND_CLOSE:
    pPVar10->contours_flag[pPVar10->n_contours] = '\0';
    if ((long)pPVar10->n_contours == 0) {
      iVar13 = 0;
    }
    else {
      iVar13 = pPVar10->contours[(long)pPVar10->n_contours + -1] + 1;
    }
    lVar12 = (long)pPVar10->n_points;
    if (iVar13 != pPVar10->n_points) {
      pPVar14 = pPVar10->points + iVar13;
      PVar7 = pPVar14->y;
      pPVar1 = pPVar10->points + lVar12;
      pPVar1->x = pPVar14->x;
      pPVar1->y = PVar7;
      goto LAB_0011011d;
    }
  default:
    goto switchD_0010ff5f_default;
  }
  pPVar14[lVar12].x = (long)(fVar2 * 64.0);
  pPVar14[lVar12].y = (long)(fVar3 * 64.0);
LAB_0011011d:
  pcVar11 = pPVar10->tags + lVar12;
LAB_00110121:
  *pcVar11 = '\x01';
  pPVar10->n_points = pPVar10->n_points + 1;
  goto switchD_0010ff5f_default;
}

Assistant:

static PVG_FT_Outline* ft_outline_convert(const plutovg_path_t* path, const plutovg_matrix_t* matrix, const plutovg_stroke_data_t* stroke_data)
{
    if(stroke_data) {
        return ft_outline_convert_stroke(path, matrix, stroke_data);
    }

    plutovg_path_iterator_t it;
    plutovg_path_iterator_init(&it, path);

    plutovg_point_t points[3];
    PVG_FT_Outline* outline = ft_outline_create(path->num_points, path->num_contours);
    while(plutovg_path_iterator_has_next(&it)) {
        switch(plutovg_path_iterator_next(&it, points)) {
        case PLUTOVG_PATH_COMMAND_MOVE_TO:
            plutovg_matrix_map_points(matrix, points, points, 1);
            ft_outline_move_to(outline, points[0].x, points[0].y);
            break;
        case PLUTOVG_PATH_COMMAND_LINE_TO:
            plutovg_matrix_map_points(matrix, points, points, 1);
            ft_outline_line_to(outline, points[0].x, points[0].y);
            break;
        case PLUTOVG_PATH_COMMAND_CUBIC_TO:
            plutovg_matrix_map_points(matrix, points, points, 3);
            ft_outline_cubic_to(outline, points[0].x, points[0].y, points[1].x, points[1].y, points[2].x, points[2].y);
            break;
        case PLUTOVG_PATH_COMMAND_CLOSE:
            ft_outline_close(outline);
            break;
        }
    }

    ft_outline_end(outline);
    return outline;
}